

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O3

bool __thiscall
tinyusdz::GeomPrimvar::get_value<tinyusdz::value::point3h>
          (GeomPrimvar *this,point3h *dest,string *err)

{
  Attribute *this_00;
  vtable_type *pvVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  half hVar3;
  byte bVar4;
  bool bVar5;
  uint32_t uVar6;
  pointer pSVar7;
  point3h *ppVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  undefined7 uVar9;
  pointer pSVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  long *local_78 [2];
  long local_68 [2];
  undefined1 local_54 [20];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if (dest == (point3h *)0x0) {
joined_r0x0049a1d2:
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
  }
  else {
    if ((this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pvVar1 = (this->_attr)._var._value.v_.vtable;
      if (pvVar1 == (vtable_type *)0x0) {
        bVar5 = false;
        uVar9 = 0;
      }
      else {
        uVar6 = (*pvVar1->type_id)();
        bVar5 = uVar6 == 4;
        uVar9 = (undefined7)((ulong)in_RCX >> 8);
      }
      bVar4 = (this->_attr)._var._blocked;
      in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT71(uVar9,bVar5 | bVar4);
      if (bVar5 != false || (bVar4 & 1) != 0) goto joined_r0x0049a1d2;
    }
    else {
      bVar4 = (this->_attr)._var._blocked;
    }
    if ((((bVar4 & 1) == 0) &&
        (pvVar1 = (this->_attr)._var._value.v_.vtable, pvVar1 != (vtable_type *)0x0)) &&
       ((uVar6 = (*pvVar1->type_id)(), uVar6 == 0 ||
        ((pvVar1 = (this->_attr)._var._value.v_.vtable, pvVar1 != (vtable_type *)0x0 &&
         (uVar6 = (*pvVar1->type_id)(), uVar6 == 1)))))) {
      pSVar10 = (this->_attr)._var._ts._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar7 = (this->_attr)._var._ts._samples.
               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pSVar7 != pSVar10) {
        if ((this->_attr)._var._ts._dirty == true) {
          tinyusdz::value::TimeSamples::update(&(this->_attr)._var._ts);
          pSVar10 = (this->_attr)._var._ts._samples.
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pSVar7 = (this->_attr)._var._ts._samples.
                   super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        if (pSVar7 != pSVar10) {
          ppVar8 = tinyusdz::value::Value::as<tinyusdz::value::point3h>(&pSVar10->value,false);
          if (ppVar8 == (point3h *)0x0) {
            return false;
          }
          (dest->z).value = (ppVar8->z).value;
          hVar3.value = (ppVar8->y).value;
          dest->x = (half)(ppVar8->x).value;
          dest->y = (half)hVar3.value;
          return true;
        }
        ::std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
      }
    }
    else {
      this_00 = &this->_attr;
      uVar6 = Attribute::type_id(this_00);
      bVar5 = IsSupportedGeomPrimvarType(uVar6);
      if (bVar5) {
        primvar::PrimVar::get_value<tinyusdz::value::point3h>
                  ((optional<tinyusdz::value::point3h> *)local_98,&(this->_attr)._var);
        bVar5 = local_98[0];
        if (local_98[0] == true) {
          (dest->z).value = CONCAT11(local_98[7],local_98[6]);
          dest->x = (half)(short)local_98._2_3_;
          dest->y = (half)(short)(CONCAT13(local_98[5],local_98._2_3_) >> 0x10);
          return true;
        }
        if (err == (string *)0x0) {
          return local_98[0];
        }
        local_78[0] = local_68;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_78,
                   "Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`",
                   "");
        local_54._0_4_ = 0x3f;
        Attribute::type_name_abi_cxx11_((string *)(local_54 + 4),this_00);
        fmt::format<unsigned_int,std::__cxx11::string>
                  ((string *)local_98,(fmt *)local_78,(string *)local_54,(uint *)(local_54 + 4),
                   in_R8);
        ::std::__cxx11::string::_M_append
                  ((char *)err,
                   CONCAT17(local_98[7],
                            CONCAT16(local_98[6],
                                     CONCAT15(local_98[5],CONCAT41(local_98._1_4_,local_98[0])))));
        paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)CONCAT17(local_98[7],
                             CONCAT16(local_98[6],
                                      CONCAT15(local_98[5],CONCAT41(local_98._1_4_,local_98[0]))));
        if (paVar2 != &local_88) {
          operator_delete(paVar2,local_88._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_54._4_8_ != &local_40) {
          operator_delete((void *)local_54._4_8_,local_40._M_allocated_capacity + 1);
        }
        if (local_78[0] == local_68) {
          return bVar5;
        }
        operator_delete(local_78[0],local_68[0] + 1);
        return bVar5;
      }
      if (err != (string *)0x0) {
        local_78[0] = local_68;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_78,"Unsupported type for GeomPrimvar. type = `{}`","");
        Attribute::type_name_abi_cxx11_((string *)(local_54 + 4),this_00);
        fmt::format<std::__cxx11::string>
                  ((string *)local_98,(fmt *)local_78,(string *)(local_54 + 4),in_RCX);
        ::std::__cxx11::string::_M_append
                  ((char *)err,
                   CONCAT17(local_98[7],
                            CONCAT16(local_98[6],
                                     CONCAT15(local_98[5],CONCAT41(local_98._1_4_,local_98[0])))));
        paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)CONCAT17(local_98[7],
                             CONCAT16(local_98[6],
                                      CONCAT15(local_98[5],CONCAT41(local_98._1_4_,local_98[0]))));
        if (paVar2 != &local_88) {
          operator_delete(paVar2,local_88._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_54._4_8_ != &local_40) {
          operator_delete((void *)local_54._4_8_,local_40._M_allocated_capacity + 1);
        }
        if (local_78[0] != local_68) {
          operator_delete(local_78[0],local_68[0] + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool GeomPrimvar::get_value(T *dest, std::string *err) const {
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<value::token>::type_id(), "`token` type is not supported as a GeomPrimvar");
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<std::vector<value::token>>::type_id(), "`token[]` type is not supported as a GeomPrimvar");

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is blocked.";
    }
    return false;
  }

  if (_attr.has_value()) {
    if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
      if (err) {
        (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                              _attr.type_name());
      }
      return false;
    }

    if (auto pv = _attr.get_value<T>()) {

      // copy
      (*dest) = pv.value();
      return true;

    } else {
      if (err) {
        (*err) += fmt::format("Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`", value::TypeTraits<T>::type_id(), _attr.type_name());
      }
      return false;
    }
  }

  if (_attr.has_timesamples()) {
    // Return the first sample.
    const auto &ts = _attr.get_var().ts_raw();
    if (ts.empty()) {
      if (err) {
        (*err) += "No TimeSample value in Attribute..";
      }
      return false;
    }
    
    if (auto pv =ts.get_samples().at(0).value.as<T>()) {
      (*dest) = (*pv);
      return true;
    }
  }

  return false;
}